

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

bool __thiscall Pig::getUntil(Pig *this,int end,string *result)

{
  ulong uVar1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = this->_cursor;
  uVar4 = uVar1;
  while( true ) {
    uVar2 = utf8_next_char((this->_text).
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&this->_cursor);
    if (uVar2 == 0) {
      return uVar1 < this->_cursor;
    }
    if (uVar2 == end) break;
    peVar3 = (this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar4 = this->_cursor;
    if ((peVar3->_M_dataplus)._M_p[uVar4] == '\0') {
LAB_0013831e:
      std::__cxx11::string::substr((ulong)local_50,(ulong)peVar3);
      std::__cxx11::string::operator=((string *)result,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return true;
    }
  }
  this->_cursor = uVar4;
  peVar3 = (this->_text).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  goto LAB_0013831e;
}

Assistant:

bool Pig::getUntil (int end, std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (c == end)
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}